

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::btQuantizedBvh(btQuantizedBvh *this,btQuantizedBvh *self,bool param_2)

{
  undefined8 uVar1;
  
  this->_vptr_btQuantizedBvh = (_func_int **)&PTR__btQuantizedBvh_0021b670;
  uVar1 = *(undefined8 *)((self->m_bvhAabbMin).m_floats + 2);
  *(undefined8 *)(this->m_bvhAabbMin).m_floats = *(undefined8 *)(self->m_bvhAabbMin).m_floats;
  *(undefined8 *)((this->m_bvhAabbMin).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((self->m_bvhAabbMax).m_floats + 2);
  *(undefined8 *)(this->m_bvhAabbMax).m_floats = *(undefined8 *)(self->m_bvhAabbMax).m_floats;
  *(undefined8 *)((this->m_bvhAabbMax).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)((self->m_bvhQuantization).m_floats + 2);
  *(undefined8 *)(this->m_bvhQuantization).m_floats =
       *(undefined8 *)(self->m_bvhQuantization).m_floats;
  *(undefined8 *)((this->m_bvhQuantization).m_floats + 2) = uVar1;
  this->m_bulletVersion = 0x11c;
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (btOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  (this->m_contiguousNodes).m_ownsMemory = true;
  (this->m_contiguousNodes).m_data = (btOptimizedBvhNode *)0x0;
  (this->m_contiguousNodes).m_size = 0;
  (this->m_contiguousNodes).m_capacity = 0;
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (btQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  (this->m_quantizedContiguousNodes).m_ownsMemory = true;
  (this->m_quantizedContiguousNodes).m_data = (btQuantizedBvhNode *)0x0;
  (this->m_quantizedContiguousNodes).m_size = 0;
  (this->m_quantizedContiguousNodes).m_capacity = 0;
  (this->m_SubtreeHeaders).m_ownsMemory = true;
  (this->m_SubtreeHeaders).m_data = (btBvhSubtreeInfo *)0x0;
  (this->m_SubtreeHeaders).m_size = 0;
  (this->m_SubtreeHeaders).m_capacity = 0;
  return;
}

Assistant:

btQuantizedBvh::btQuantizedBvh(btQuantizedBvh &self, bool /* ownsMemory */) :
m_bvhAabbMin(self.m_bvhAabbMin),
m_bvhAabbMax(self.m_bvhAabbMax),
m_bvhQuantization(self.m_bvhQuantization),
m_bulletVersion(BT_BULLET_VERSION)
{

}